

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O0

void __thiscall MathML::AST::ConstantExpression::ConstantExpression(ConstantExpression *this)

{
  INode *in_RDI;
  
  INode::INode(in_RDI);
  in_RDI->_vptr_INode = (_func_int **)&PTR__ConstantExpression_00e6dbd8;
  *(undefined4 *)&in_RDI[1]._vptr_INode = 0;
  std::__cxx11::string::string((string *)(in_RDI + 3));
  in_RDI[7]._vptr_INode = (_func_int **)0x0;
  return;
}

Assistant:

ConstantExpression::ConstantExpression()
                : mType ( SCALAR_INVALID )
                , mErrorHandler( 0 )
        {}